

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

void __thiscall LogMessage::Flush(LogMessage *this)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->str_,"\n",1);
  if (re2::FLAGS_minloglevel <= this->severity_) {
    Flush(this);
  }
  this->flushed_ = true;
  return;
}

Assistant:

void Flush() {
    stream() << "\n";
    if (severity_ >= re2::FLAGS_minloglevel) {
      string s = str_.str();
      size_t n = s.size();
      if (fwrite(s.data(), 1, n, stderr) < n) {}  // shut up gcc
    }
    flushed_ = true;
  }